

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.h
# Opt level: O0

bool __thiscall spv::Builder::isValidInitializer(Builder *this,Id resultId)

{
  bool bVar1;
  undefined1 local_15;
  Id resultId_local;
  Builder *this_local;
  
  bVar1 = isConstant(this,resultId);
  local_15 = true;
  if (!bVar1) {
    local_15 = isGlobalVariable(this,resultId);
  }
  return local_15;
}

Assistant:

bool isValidInitializer(Id resultId) const { return isConstant(resultId) || isGlobalVariable(resultId); }